

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.h
# Opt level: O2

uint32_t __thiscall asmjit::_abi_1_10::InstNode::getRewriteIndex(InstNode *this,uint32_t *id)

{
  ulong uVar1;
  uint32_t *puVar2;
  
  puVar2 = &(this->_baseInst)._extraReg._id;
  if (id < puVar2) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/arm/../arm/../core/../core/builder.h"
               ,0x36e,"array <= id");
  }
  uVar1 = (long)id - (long)puVar2 >> 2;
  if (uVar1 < 0x20) {
    return (uint32_t)uVar1;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/arm/../arm/../core/../core/builder.h"
             ,0x371,"index < 32");
}

Assistant:

inline uint32_t getRewriteIndex(const uint32_t* id) const noexcept {
    const uint32_t* array = _getRewriteArray();
    ASMJIT_ASSERT(array <= id);

    size_t index = (size_t)(id - array);
    ASMJIT_ASSERT(index < 32);

    return uint32_t(index);
  }